

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::generateDSAParameters
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  void *pvVar1;
  SoftHSM *pSVar2;
  DSAParameters *this_00;
  char cVar3;
  int iVar4;
  Session *this_01;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  CK_RV CVar6;
  long *plVar7;
  ByteString *pBVar8;
  unsigned_long *puVar9;
  CK_ULONG ulCount_00;
  CK_ULONG CVar10;
  long lVar11;
  char *format;
  ulong uVar12;
  bool bVar13;
  AsymmetricParameters *p;
  CK_KEY_TYPE keyType;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  CK_OBJECT_CLASS objClass;
  CK_ATTRIBUTE paramsAttribs [32];
  CK_BBOOL local_491;
  CK_OBJECT_HANDLE_PTR local_490;
  Token *local_488;
  SoftHSM *local_480;
  DSAParameters *local_478;
  DSAParameters *local_470;
  long *local_468;
  undefined8 local_460;
  ByteString local_458;
  ByteString local_430;
  ByteString local_408;
  undefined8 local_3e0;
  OSAttribute local_3d8;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  local_491 = isOnToken;
  this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_01 == (Session *)0x0) {
    return 0xb3;
  }
  local_488 = Session::getToken(this_01);
  if (local_488 == (Token *)0x0) {
    return 5;
  }
  local_480 = this;
  if (ulCount == 0) {
LAB_00138629:
    softHSMLog(6,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2313,"Missing CKA_PRIME_BITS in pTemplate");
    return 0xd0;
  }
  puVar9 = &pTemplate->ulValueLen;
  uVar12 = 0;
  lVar11 = 0;
  CVar10 = ulCount;
  do {
    if (((_CK_ATTRIBUTE *)(puVar9 + -2))->type == 0x134) {
      if (*puVar9 != 8) {
        format = "CKA_SUB_PRIME_BITS does not have the size of CK_ULONG";
        iVar4 = 0x2306;
LAB_00138699:
        softHSMLog(6,"generateDSAParameters",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,iVar4,format);
        return 0x13;
      }
      lVar11 = *(long *)puVar9[-1];
    }
    else if (((_CK_ATTRIBUTE *)(puVar9 + -2))->type == 0x133) {
      if (*puVar9 != 8) {
        format = "CKA_PRIME_BITS does not have the size of CK_ULONG";
        iVar4 = 0x22fe;
        goto LAB_00138699;
      }
      uVar12 = *(ulong *)puVar9[-1];
    }
    puVar9 = puVar9 + 3;
    CVar10 = CVar10 - 1;
  } while (CVar10 != 0);
  if (uVar12 == 0) goto LAB_00138629;
  local_490 = phKey;
  if ((lVar11 != 0) && ((0x7ff < uVar12 && lVar11 != 0x100 || (lVar11 != 0xa0 && uVar12 < 0x800))))
  {
    softHSMLog(6,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x231b,"CKA_SUB_PRIME_BITS is ignored");
  }
  local_478 = (DSAParameters *)0x0;
  pCVar5 = CryptoFactory::i();
  iVar4 = (*pCVar5->_vptr_CryptoFactory[2])(pCVar5,2);
  plVar7 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar7 == (long *)0x0) {
    return 5;
  }
  cVar3 = (**(code **)(*plVar7 + 0x78))(plVar7,&local_478,uVar12,0);
  if (cVar3 == '\0') {
    softHSMLog(3,"generateDSAParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2324,"Could not generate parameters");
    pCVar5 = CryptoFactory::i();
    (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,plVar7);
    return 5;
  }
  local_470 = local_478;
  local_3e0 = 6;
  local_460 = 1;
  local_468 = plVar7;
  memset(&local_338,0,0x300);
  local_338.ulValueLen = 8;
  local_320 = 1;
  local_318 = &local_491;
  local_310 = 1;
  local_308 = 2;
  local_300 = &isPrivate;
  local_2f8 = 1;
  local_2f0 = 0x100;
  local_2e8 = &local_460;
  local_2e0 = 8;
  CVar6 = 0xd1;
  local_338.pValue = &local_3e0;
  if (0x1c < ulCount) goto LAB_00138593;
  CVar10 = 4;
  uVar12 = 1;
  do {
    ulCount_00 = CVar10;
    if ((2 < pTemplate->type) && (pTemplate->type != 0x100)) {
      ulCount_00 = CVar10 + 1;
      (&local_338)[CVar10].ulValueLen = pTemplate->ulValueLen;
      pvVar1 = pTemplate->pValue;
      (&local_338)[CVar10].type = pTemplate->type;
      (&local_338)[CVar10].pValue = pvVar1;
    }
    if (0x1c < ulCount) break;
    pTemplate = pTemplate + 1;
    bVar13 = uVar12 < ulCount;
    CVar10 = ulCount_00;
    uVar12 = uVar12 + 1;
  } while (bVar13);
  CVar6 = CreateObject(local_480,hSession,&local_338,ulCount_00,local_490,4);
  if (CVar6 != 0) goto LAB_00138593;
  plVar7 = (long *)HandleManager::getObject(local_480->handleManager,*local_490);
  CVar6 = 6;
  if (((plVar7 == (long *)0x0) || (cVar3 = (**(code **)(*plVar7 + 0x50))(plVar7), cVar3 == '\0')) ||
     (cVar3 = (**(code **)(*plVar7 + 0x58))(plVar7,1), cVar3 == '\0')) goto LAB_00138593;
  OSAttribute::OSAttribute(&local_3d8,true);
  cVar3 = (**(code **)(*plVar7 + 0x40))(plVar7,0x163,&local_3d8);
  OSAttribute::~OSAttribute(&local_3d8);
  this_00 = local_470;
  if (cVar3 == '\0') {
    cVar3 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_3d8,0x2000);
    cVar3 = (**(code **)(*plVar7 + 0x40))(plVar7,0x166,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
  }
  ByteString::ByteString(&local_408);
  ByteString::ByteString(&local_430);
  ByteString::ByteString(&local_458);
  if (isPrivate == '\0') {
    pBVar8 = DSAParameters::getP(this_00);
    ByteString::operator=(&local_408,pBVar8);
    pBVar8 = DSAParameters::getQ(this_00);
    ByteString::operator=(&local_430,pBVar8);
    pBVar8 = DSAParameters::getG(this_00);
    ByteString::operator=(&local_458,pBVar8);
  }
  else {
    pBVar8 = DSAParameters::getP(this_00);
    Token::encrypt(local_488,(char *)pBVar8,(int)&local_408);
    pBVar8 = DSAParameters::getQ(this_00);
    Token::encrypt(local_488,(char *)pBVar8,(int)&local_430);
    pBVar8 = DSAParameters::getG(this_00);
    Token::encrypt(local_488,(char *)pBVar8,(int)&local_458);
  }
  if (cVar3 == '\0') {
LAB_0013894c:
    (**(code **)(*plVar7 + 0x68))(plVar7);
    cVar3 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_3d8,&local_408);
    cVar3 = (**(code **)(*plVar7 + 0x40))(plVar7,0x130,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar3 == '\0') goto LAB_0013894c;
    OSAttribute::OSAttribute(&local_3d8,&local_430);
    cVar3 = (**(code **)(*plVar7 + 0x40))(plVar7,0x131,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar3 == '\0') goto LAB_0013894c;
    OSAttribute::OSAttribute(&local_3d8,&local_458);
    cVar3 = (**(code **)(*plVar7 + 0x40))(plVar7,0x132,&local_3d8);
    OSAttribute::~OSAttribute(&local_3d8);
    if (cVar3 == '\0') goto LAB_0013894c;
    cVar3 = (**(code **)(*plVar7 + 0x60))(plVar7);
  }
  local_458._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_458.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_430._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_430.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_408._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_408.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  CVar6 = 6;
  if (cVar3 != '\0') {
    CVar6 = 0;
  }
LAB_00138593:
  plVar7 = local_468;
  (**(code **)(*local_468 + 200))(local_468,local_478);
  pCVar5 = CryptoFactory::i();
  (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,plVar7);
  pSVar2 = local_480;
  if (CVar6 == 0) {
    return 0;
  }
  if (*local_490 == 0) {
    return CVar6;
  }
  plVar7 = (long *)HandleManager::getObject(local_480->handleManager,*local_490);
  HandleManager::destroyObject(pSVar2->handleManager,*local_490);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x70))(plVar7);
  }
  *local_490 = 0;
  return CVar6;
}

Assistant:

CK_RV SoftHSM::generateDSAParameters
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t bitLen = 0;
	size_t qLen = 0;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_SUB_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_SUB_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				qLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			default:
				break;
		}
	}

	// CKA_PRIME_BITS must be specified
	if (bitLen == 0)
	{
		INFO_MSG("Missing CKA_PRIME_BITS in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// No real choice for CKA_SUB_PRIME_BITS
	if ((qLen != 0) &&
	    (((bitLen >= 2048) && (qLen != 256)) ||
	     ((bitLen < 2048) && (qLen != 160))))
		INFO_MSG("CKA_SUB_PRIME_BITS is ignored");


	// Generate domain parameters
	AsymmetricParameters* p = NULL;
	AsymmetricAlgorithm* dsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
	if (dsa == NULL) return CKR_GENERAL_ERROR;
	if (!dsa->generateParameters(&p, (void *)bitLen))
	{
		ERROR_MSG("Could not generate parameters");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);
		return CKR_GENERAL_ERROR;
	}

	DSAParameters* params = (DSAParameters*) p;

	CK_RV rv = CKR_OK;

	// Create the domain parameter object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_DOMAIN_PARAMETERS;
	CK_KEY_TYPE keyType = CKK_DSA;
	CK_ATTRIBUTE paramsAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG paramsAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - paramsAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
		default:
			paramsAttribs[paramsAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, paramsAttribs, paramsAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DSA_PARAMETER_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// DSA Domain Parameters Attributes
			ByteString prime;
			ByteString subprime;
			ByteString generator;
			if (isPrivate)
			{
				token->encrypt(params->getP(), prime);
				token->encrypt(params->getQ(), subprime);
				token->encrypt(params->getG(), generator);
			}
			else
			{
				prime = params->getP();
				subprime = params->getQ();
				generator = params->getG();
			}
			bOK = bOK && osobject->setAttribute(CKA_PRIME, prime);
			bOK = bOK && osobject->setAttribute(CKA_SUBPRIME, subprime);
			bOK = bOK && osobject->setAttribute(CKA_BASE, generator);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	dsa->recycleParameters(p);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);

	// Remove parameters that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* osparams = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (osparams) osparams->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}